

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.c
# Opt level: O0

void tommy_list_sort(tommy_list *list,undefined1 *cmp)

{
  tommy_bool_t tVar1;
  long in_FS_OFFSET;
  tommy_node *head;
  undefined1 *cmp_local;
  tommy_list *list_local;
  tommy_chain chain;
  
  chain.tail = *(tommy_node **)(in_FS_OFFSET + 0x28);
  tVar1 = tommy_list_empty(list);
  if (tVar1 == 0) {
    list_local = &tommy_list_head(list)->next;
    chain.head = ((tommy_node *)list_local)->prev;
    tommy_chain_mergesort((tommy_chain *)&list_local,cmp);
    tommy_list_set(list,(tommy_node *)list_local,chain.head);
  }
  if (*(tommy_node **)(in_FS_OFFSET + 0x28) != chain.tail) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_list_sort(tommy_list* list, tommy_compare_func* cmp)
{
	tommy_chain chain;
	tommy_node* head;

	if (tommy_list_empty(list))
		return;

	head = tommy_list_head(list);

	/* create a chain from the list */
	chain.head = head;
	chain.tail = head->prev;

	tommy_chain_mergesort(&chain, cmp);

	/* restore the list */
	tommy_list_set(list, chain.head, chain.tail);
}